

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstToYaml.cpp
# Opt level: O2

void MyCompiler::Util::processAst<MyCompiler::ProcedureDeclaration>
               (ProcedureDeclaration *ast,int level,
               vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *items,string *name)

{
  Block *ast_00;
  int iVar1;
  allocator local_7d;
  int local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_7c = level;
  std::__cxx11::string::string((string *)&local_38,"- ident: \"",&local_7d);
  std::operator+(&local_58,&local_38,
                 &(((ast->pIdent).super___shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_AbstractAstNode).value);
  std::operator+(&local_78,&local_58,"\"");
  std::
  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>::
  emplace_back<int&,std::__cxx11::string>
            ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
              *)items,&local_7c,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  iVar1 = local_7c;
  ast_00 = (ast->pBlock).super___shared_ptr<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)&local_78,"block",(allocator *)&local_58);
  processAst<MyCompiler::Block>(ast_00,iVar1 + 1,items,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void MyCompiler::Util::processAst<MyCompiler::ProcedureDeclaration>(
        ProcedureDeclaration &ast, int level,
        std::vector<std::pair<int, std::string>> &items, const std::string &name)
{
    items.emplace_back(level, std::string("- ident: \"") + ast.pIdent->value + "\"");
    processAst(*ast.pBlock, level + 1, items, "block");
}